

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O2

uint32_t farmhash32_sa(char *s,size_t len)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint32_t uVar8;
  uint32_t uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  undefined4 uVar13;
  int iVar14;
  long lVar15;
  undefined4 uVar16;
  undefined1 (*pauVar17) [16];
  int iVar18;
  int iVar19;
  uint h;
  uint32_t h_00;
  bool bVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  
  if (0x18 < len) {
    if (len < 0x28) {
      iVar19 = *(int *)(s + (len - 0x10)) + (int)len;
      h = *(int *)(s + (len - 4)) + (int)len;
      iVar10 = *(int *)(s + (len - 0x14));
      uVar8 = mur(iVar19 + 0xb5c7f383,h);
      uVar8 = mur(iVar10 + 0xb5c7f383U,uVar8);
      uVar8 = mur(h >> 0x15 | h * 0x800,uVar8);
      iVar14 = *(int *)(s + (len - 0xc));
      h_00 = h + uVar8 + iVar14;
      uVar9 = mur(iVar10 + 0xb5c7f383U + *(int *)(s + (len - 8)),h_00);
      uVar8 = crc32(uVar8 + iVar14 + h_00,uVar9 * 0x1b873593 + -0x4a380c7d + iVar19);
      uVar8 = farmhash32_mk_len_13_to_24(s,len + 1 >> 1,uVar8);
      uVar8 = uVar8 + uVar9 * 0x1b873593;
    }
    else {
      if (len < 0x50) {
        auVar33._8_4_ = 0xcc9e2d51;
        auVar33._0_8_ = 0xcc9e2d51cc9e2d51;
        auVar33._12_4_ = 0xcc9e2d51;
        auVar30._8_4_ = 0xbe0c56a1;
        auVar30._0_8_ = 0xbe0c56a1be0c56a1;
        auVar30._12_4_ = 0xbe0c56a1;
        auVar25 = vpmulld_avx(*(undefined1 (*) [16])(s + (len - 0x10)),auVar33);
        auVar29 = vpshufd_avx(*(undefined1 (*) [16])(s + 0x10),0x39);
        auVar24 = vpaddd_avx(*(undefined1 (*) [16])(s + (len - 0xf >> 1)),auVar30);
        auVar29 = vpaddd_avx(auVar29,auVar30);
        auVar28 = vpaddd_avx(*(undefined1 (*) [16])s,auVar24);
        auVar25 = vpaddd_avx(auVar25,*(undefined1 (*) [16])(s + 0x10));
        auVar5._8_4_ = 0x51;
        auVar5._0_8_ = 0x5100000051;
        auVar5._12_4_ = 0x51;
        auVar21 = vpaddd_avx512vl(auVar28,auVar5);
        auVar22 = vpmulld_avx(*(undefined1 (*) [16])(s + (len - 0x20)),auVar33);
        auVar28 = vpaddd_avx(auVar29 ^ *(undefined1 (*) [16])(s + (len - 0xf >> 1)),
                             *(undefined1 (*) [16])s);
        auVar22 = vprold_avx512vl(auVar22,0x11);
        auVar6._8_4_ = 0x1b873593;
        auVar6._0_8_ = 0x1b8735931b873593;
        auVar6._12_4_ = 0x1b873593;
        auVar23 = vpmulld_avx512vl(auVar22,auVar6);
        auVar22 = vpaddd_avx(auVar21,auVar24);
        auVar27 = vpaddd_avx(auVar25 ^ auVar22,*(undefined1 (*) [16])(s + (len - 0x20)));
        auVar32._8_4_ = 0xe6546b64;
        auVar32._0_8_ = 0xe6546b64e6546b64;
        auVar32._12_4_ = 0xe6546b64;
        auVar24 = vprold_avx512vl(auVar23 ^ auVar21,0x13);
        auVar7._8_4_ = 5;
        auVar7._0_8_ = 0x500000005;
        auVar7._12_4_ = 5;
        auVar21 = vpmulld_avx512vl(auVar24,auVar7);
        auVar24 = vpaddd_avx(*(undefined1 (*) [16])(s + (len - 0x10)),auVar32);
        auVar24 = vpaddd_avx(auVar24,auVar21);
        auVar22 = vpshufb_avx(auVar29,auVar22);
        auVar21 = vpshufb_avx(auVar27,auVar24);
        auVar29 = vpaddd_avx(auVar27,auVar28);
        auVar28 = vpaddd_avx(auVar29,auVar28);
        auVar25 = vpaddd_avx(auVar25,auVar22 ^ auVar32);
        auVar22 = vpmulld_avx(auVar28,auVar33);
        auVar28 = vpaddd_avx(auVar25,auVar21);
        auVar25 = vpbroadcastd_avx512vl();
        auVar25 = vpaddd_avx(auVar22,auVar25);
      }
      else {
        uVar11 = (len - 1) / 0x50;
        auVar29._8_4_ = 0xbe0c56a1;
        auVar29._0_8_ = 0xbe0c56a1be0c56a1;
        auVar29._12_4_ = 0xbe0c56a1;
        auVar24._8_4_ = 0x51;
        auVar24._0_8_ = 0x5100000051;
        auVar24._12_4_ = 0x51;
        auVar28._8_8_ = 0xe6546b64e6546b64;
        auVar28._0_8_ = 0xe6546b64e6546b64;
        auVar22._8_4_ = 0xcc9e2d51;
        auVar22._0_8_ = 0xcc9e2d51cc9e2d51;
        auVar22._12_4_ = 0xcc9e2d51;
        auVar27._8_4_ = 0x1b873593;
        auVar27._0_8_ = 0x1b8735931b873593;
        auVar27._12_4_ = 0x1b873593;
        auVar21._8_4_ = 5;
        auVar21._0_8_ = 0x500000005;
        auVar21._12_4_ = 5;
        uVar12 = uVar11;
        pauVar17 = (undefined1 (*) [16])s;
        auVar25 = auVar29;
        while (bVar20 = uVar12 != 0, uVar12 = uVar12 - 1, bVar20) {
          pauVar1 = pauVar17 + 4;
          pauVar2 = pauVar17 + 1;
          pauVar3 = pauVar17 + 3;
          auVar23 = *pauVar17;
          pauVar4 = pauVar17 + 2;
          pauVar17 = pauVar17 + 5;
          auVar26 = vpmulld_avx(*pauVar1,auVar22);
          auVar25 = vpaddd_avx(*pauVar2,auVar25);
          auVar24 = vpaddd_avx(auVar23,auVar24);
          auVar29 = vpaddd_avx(*pauVar4,auVar29);
          auVar5 = vpaddd_avx(*pauVar1,auVar28);
          auVar24 = vpaddd_avx(auVar24,auVar29);
          auVar7 = vpshufd_avx(auVar25,0x39);
          auVar29 = vpaddd_avx(auVar24,auVar29);
          auVar25 = vpaddd_avx(auVar26,*pauVar2);
          auVar26 = vpmulld_avx(*pauVar3,auVar22);
          auVar26 = vprold_avx512vl(auVar26,0x11);
          auVar26 = vpmulld_avx(auVar26,auVar27);
          auVar6 = vpshufb_avx(auVar7,auVar29);
          auVar24 = vprold_avx512vl(auVar26 ^ auVar24,0x13);
          auVar29 = vpaddd_avx(*pauVar3,auVar25 ^ auVar29);
          auVar23 = vpaddd_avx(*pauVar4 ^ auVar7,auVar23);
          auVar24 = vpmulld_avx(auVar24,auVar21);
          auVar28 = vpaddd_avx(auVar25,auVar6 ^ auVar28);
          auVar24 = vpaddd_avx(auVar5,auVar24);
          auVar5 = vpshufb_avx(auVar29,auVar24);
          auVar29 = vpaddd_avx(auVar29,auVar23);
          auVar25 = vpaddd_avx(auVar29,auVar23);
          auVar29 = vpmulld_avx(auVar29,auVar22);
          auVar28 = vpaddd_avx(auVar28,auVar5);
        }
        lVar15 = uVar11 * -0x50 + len;
        if (lVar15 != 0) {
          auVar27 = vpbroadcastd_avx512vl();
          auVar24 = vpaddd_avx(auVar24,auVar27);
          auVar21 = vpmulld_avx(*(undefined1 (*) [16])(s + lVar15 + -0x10 + uVar11 * 0x50),auVar22);
          auVar25 = vpaddd_avx(*(undefined1 (*) [16])(s + lVar15 + -0x40 + uVar11 * 0x50),auVar25);
          auVar24 = vpaddd_avx(auVar24,*(undefined1 (*) [16])(s + lVar15 + -0x50 + uVar11 * 0x50));
          auVar29 = vpaddd_avx(auVar29,*(undefined1 (*) [16])(s + lVar15 + -0x30 + uVar11 * 0x50));
          auVar27 = vpaddd_avx(*(undefined1 (*) [16])(s + lVar15 + -0x10 + uVar11 * 0x50),auVar28);
          auVar24 = vpaddd_avx(auVar24,auVar29);
          auVar5 = vpshufd_avx(auVar25,0x39);
          auVar29 = vpaddd_avx(auVar24,auVar29);
          auVar25 = vpaddd_avx(auVar21,*(undefined1 (*) [16])(s + lVar15 + -0x40 + uVar11 * 0x50));
          auVar21 = vpmulld_avx(*(undefined1 (*) [16])(s + lVar15 + -0x20 + uVar11 * 0x50),auVar22);
          auVar21 = vprold_avx512vl(auVar21,0x11);
          auVar23._8_4_ = 0x1b873593;
          auVar23._0_8_ = 0x1b8735931b873593;
          auVar23._12_4_ = 0x1b873593;
          auVar21 = vpmulld_avx512vl(auVar21,auVar23);
          auVar23 = vpshufb_avx(auVar5,auVar29);
          auVar24 = vprold_avx512vl(auVar21 ^ auVar24,0x13);
          auVar26._8_4_ = 5;
          auVar26._0_8_ = 0x500000005;
          auVar26._12_4_ = 5;
          auVar24 = vpmulld_avx512vl(auVar24,auVar26);
          auVar21 = vpaddd_avx(auVar5 ^ *(undefined1 (*) [16])(s + lVar15 + -0x30 + uVar11 * 0x50),
                               *(undefined1 (*) [16])(s + lVar15 + -0x50 + uVar11 * 0x50));
          auVar29 = vpaddd_avx(*(undefined1 (*) [16])(s + lVar15 + -0x20 + uVar11 * 0x50),
                               auVar29 ^ auVar25);
          auVar28 = vpaddd_avx(auVar25,auVar23 ^ auVar28);
          auVar24 = vpaddd_avx(auVar27,auVar24);
          auVar27 = vpshufb_avx(auVar29,auVar24);
          auVar29 = vpaddd_avx(auVar29,auVar21);
          auVar25 = vpaddd_avx(auVar29,auVar21);
          auVar29 = vpmulld_avx(auVar29,auVar22);
          auVar28 = vpaddd_avx(auVar28,auVar27);
        }
      }
      auVar22 = vpshufd_avx(auVar25,0x39);
      auVar25._8_4_ = 0xcc9e2d51;
      auVar25._0_8_ = 0xcc9e2d51cc9e2d51;
      auVar25._12_4_ = 0xcc9e2d51;
      auVar31._8_4_ = 0x1b873593;
      auVar31._0_8_ = 0x1b8735931b873593;
      auVar31._12_4_ = 0x1b873593;
      auVar29 = vpmulld_avx(auVar29,auVar25);
      auVar25 = vpmulld_avx(auVar22,auVar25);
      auVar24 = vpmulld_avx(auVar24,auVar31);
      auVar28 = vpmulld_avx(auVar22 ^ auVar28,auVar31);
      auVar22 = vpshufb_avx(auVar25,auVar29);
      auVar24 = vpaddd_avx(auVar24,auVar29);
      auVar29 = vpaddd_avx(auVar24,auVar29);
      auVar28 = vpaddd_avx(auVar28,auVar22);
      auVar22 = vpshufb_avx(auVar29,auVar24);
      auVar25 = vpaddd_avx(auVar28,auVar25);
      uVar13 = crc32(auVar29._0_4_,auVar29._12_4_);
      auVar28 = vpaddd_avx(auVar25,auVar28);
      iVar10 = crc32(auVar29._4_4_,auVar25._0_4_);
      auVar28 = auVar28 ^ auVar22;
      iVar14 = crc32(uVar13,auVar25._8_4_);
      uVar13 = crc32(auVar29._8_4_ * -0x3361d2af,auVar25._4_4_);
      iVar10 = crc32(iVar10 * -0x3361d2af,auVar25._12_4_);
      iVar19 = crc32(uVar13,auVar28._0_4_);
      uVar13 = crc32(iVar14 * -0x3361d2af,auVar28._4_4_);
      iVar14 = crc32(iVar10,auVar28._8_4_);
      uVar16 = crc32(iVar19 * -0x3361d2af,auVar28._12_4_);
      uVar13 = crc32(uVar13,auVar24._0_4_);
      iVar18 = crc32(iVar14 * -0x3361d2af,auVar24._4_4_);
      iVar19 = crc32(uVar16,auVar24._8_4_);
      iVar14 = crc32(uVar13,auVar24._12_4_);
      uVar8 = ((iVar18 + iVar10) - (iVar14 + iVar19)) * -0x3361d2af;
    }
    return uVar8;
  }
  if (len < 0xd) {
    if (len < 5) {
      uVar8 = farmhash32_mk_len_0_to_4(s,len,0);
      return uVar8;
    }
    uVar8 = farmhash32_mk_len_5_to_12(s,len,0);
    return uVar8;
  }
  uVar8 = farmhash32_mk_len_13_to_24(s,len,0);
  return uVar8;
}

Assistant:

uint32_t farmhash32_sa(const char *s, size_t len) {
  const uint32_t seed = 81;
  if (len <= 24) {
    return len <= 12 ?
        (len <= 4 ?
         farmhash32_mk_len_0_to_4(s, len, 0) :
         farmhash32_mk_len_5_to_12(s, len, 0)) :
        farmhash32_mk_len_13_to_24(s, len, 0);
  }

  if (len < 40) {
    uint32_t a = len, b = seed * c2, c = a + b;
    a += fetch32(s + len - 4);
    b += fetch32(s + len - 20);
    c += fetch32(s + len - 16);
    uint32_t d = a;
    a = ror32(a, 21);
    a = mur(a, mur(b, mur(c, d)));
    a += fetch32(s + len - 12);
    b += fetch32(s + len - 8);
    d += a;
    a += d;
    b = mur(b, d) * c2;
    a = _mm_crc32_u32(a, b + c);
    return farmhash32_mk_len_13_to_24(s, (len + 1) / 2, a) + b;
  }

  const __m128i cc1 = _mm_set1_epi32(c1);
  const __m128i cc2 = _mm_set1_epi32(c2);
  __m128i h = _mm_set1_epi32(seed);
  __m128i g = _mm_set1_epi32(c1 * seed);
  __m128i f = g;
  __m128i k = _mm_set1_epi32(0xe6546b64);
  if (len < 80) {
    __m128i a = fetch128(s);
    __m128i b = fetch128(s + 16);
    __m128i c = fetch128(s + (len - 15) / 2);
    __m128i d = fetch128(s + len - 32);
    __m128i e = fetch128(s + len - 16);
    h = add32x4(h, a);
    g = add32x4(g, b);
    g = shuf32x4_0_3_2_1(g);
    f = add32x4(f, c);
    __m128i be = add32x4(b, mul32x4(e, cc1));
    h = add32x4(h, f);
    f = add32x4(f, h);
    h = add32x4(murk(d, h, cc1, cc2, k), e);
    k = xor128(k, _mm_shuffle_epi8(g, f));
    g = add32x4(xor128(c, g), a);
    f = add32x4(xor128(be, f), d);
    k = add32x4(k, be);
    k = add32x4(k, _mm_shuffle_epi8(f, h));
    f = add32x4(f, g);
    g = add32x4(g, f);
    g = add32x4(_mm_set1_epi32(len), mul32x4(g, cc1));
  } else {
    // len >= 80
    // The following is loosely modelled after farmhash32_mk.
    size_t iters = (len - 1) / 80;
    len -= iters * 80;

#define CHUNK() do {                             \
  __m128i a = fetch128(s);                       \
  __m128i b = fetch128(s + 16);                  \
  __m128i c = fetch128(s + 32);                  \
  __m128i d = fetch128(s + 48);                  \
  __m128i e = fetch128(s + 64);                  \
  h = add32x4(h, a);                             \
  g = add32x4(g, b);                             \
  g = shuf32x4_0_3_2_1(g);                       \
  f = add32x4(f, c);                             \
  __m128i be = add32x4(b, mul32x4(e, cc1));      \
  h = add32x4(h, f);                             \
  f = add32x4(f, h);                             \
  h = add32x4(murk(d, h, cc1, cc2, k), e);       \
  k = xor128(k, _mm_shuffle_epi8(g, f));         \
  g = add32x4(xor128(c, g), a);                  \
  f = add32x4(xor128(be, f), d);                 \
  k = add32x4(k, be);                            \
  k = add32x4(k, _mm_shuffle_epi8(f, h));        \
  f = add32x4(f, g);                             \
  g = add32x4(g, f);                             \
  f = mul32x4(f, cc1);                           \
} while (0)

    while (iters-- != 0) {
      CHUNK();
      s += 80;
    }

    if (len != 0) {
      h = add32x4(h, _mm_set1_epi32(len));
      s = s + len - 80;
      CHUNK();
    }
  }

  g = shuf32x4_0_3_2_1(g);
  k = xor128(k, g);
  f = mul32x4(f, cc1);
  k = mul32x4(k, cc2);
  g = mul32x4(g, cc1);
  h = mul32x4(h, cc2);
  k = add32x4(k, _mm_shuffle_epi8(g, f));
  h = add32x4(h, f);
  f = add32x4(f, h);
  g = add32x4(g, k);
  k = add32x4(k, g);
  k = xor128(k, _mm_shuffle_epi8(f, h));
  __m128i buf[4];
  buf[0] = f;
  buf[1] = g;
  buf[2] = k;
  buf[3] = h;
  s = (char*) buf;
  uint32_t x = fetch32(s);
  uint32_t y = fetch32(s+4);
  uint32_t z = fetch32(s+8);
  x = _mm_crc32_u32(x, fetch32(s+12));
  y = _mm_crc32_u32(y, fetch32(s+16));
  z = _mm_crc32_u32(z * c1, fetch32(s+20));
  x = _mm_crc32_u32(x, fetch32(s+24));
  y = _mm_crc32_u32(y * c1, fetch32(s+28));
  uint32_t o = y;
  z = _mm_crc32_u32(z, fetch32(s+32));
  x = _mm_crc32_u32(x * c1, fetch32(s+36));
  y = _mm_crc32_u32(y, fetch32(s+40));
  z = _mm_crc32_u32(z * c1, fetch32(s+44));
  x = _mm_crc32_u32(x, fetch32(s+48));
  y = _mm_crc32_u32(y * c1, fetch32(s+52));
  z = _mm_crc32_u32(z, fetch32(s+56));
  x = _mm_crc32_u32(x, fetch32(s+60));
  return (o - x + y - z) * c1;
}